

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::write_type_spec(t_json_generator *this,t_type *ttype)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string local_258;
  allocator local_231;
  string local_230;
  t_type *local_210;
  t_type *etype_1;
  allocator local_1e1;
  string local_1e0;
  t_type *local_1c0;
  t_type *etype;
  allocator local_191;
  string local_190;
  string local_170;
  allocator local_149;
  string local_148;
  t_type *local_128;
  t_type *vtype;
  t_type *ktype;
  allocator local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  reference local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *annotation;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  string local_68;
  string local_38;
  t_map *local_18;
  t_type *ttype_local;
  t_json_generator *this_local;
  
  local_18 = (t_map *)ttype;
  ttype_local = (t_type *)this;
  local_18 = (t_map *)t_type::get_true_type(ttype);
  get_type_name_abi_cxx11_(&local_38,this,(t_type *)local_18);
  write_string(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&(local_18->super_t_container).super_t_type.annotations_);
  if (sVar3 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,"annotations",(allocator *)((long)&__range2 + 7));
    write_key_and(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    start_object(this,true);
    this_00 = &(local_18->super_t_container).super_t_type.annotations_;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_00);
    annotation = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&annotation), bVar1) {
      local_90 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&__end2);
      std::__cxx11::string::string((string *)&local_b0,(string *)local_90);
      std::__cxx11::string::string((string *)&local_d0,(string *)&local_90->second);
      write_key_and_string(this,&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    end_object(this);
  }
  uVar2 = (*(local_18->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xb])();
  if (((uVar2 & 1) == 0) &&
     (uVar2 = (*(local_18->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xc])(),
     (uVar2 & 1) == 0)) {
    uVar2 = (*(local_18->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(local_18->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
      if ((uVar2 & 1) == 0) {
        uVar2 = (*(local_18->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
        if ((uVar2 & 1) != 0) {
          local_210 = t_set::get_elem_type((t_set *)local_18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_230,"elemTypeId",&local_231);
          get_type_name_abi_cxx11_(&local_258,this,local_210);
          write_key_and_string(this,&local_230,&local_258);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_230);
          std::allocator<char>::~allocator((allocator<char> *)&local_231);
          write_type_spec_object(this,"elemType",local_210);
        }
      }
      else {
        local_1c0 = t_list::get_elem_type((t_list *)local_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1e0,"elemTypeId",&local_1e1);
        get_type_name_abi_cxx11_((string *)&etype_1,this,local_1c0);
        write_key_and_string(this,&local_1e0,(string *)&etype_1);
        std::__cxx11::string::~string((string *)&etype_1);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
        write_type_spec_object(this,"elemType",local_1c0);
      }
    }
    else {
      vtype = t_map::get_key_type(local_18);
      local_128 = t_map::get_val_type(local_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"keyTypeId",&local_149);
      get_type_name_abi_cxx11_(&local_170,this,vtype);
      write_key_and_string(this,&local_148,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,"valueTypeId",&local_191);
      get_type_name_abi_cxx11_((string *)&etype,this,local_128);
      write_key_and_string(this,&local_190,(string *)&etype);
      std::__cxx11::string::~string((string *)&etype);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      write_type_spec_object(this,"keyType",vtype);
      write_type_spec_object(this,"valueType",local_128);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"class",&local_f1);
    get_qualified_name_abi_cxx11_((string *)&ktype,this,(t_type *)local_18);
    write_key_and_string(this,&local_f0,(string *)&ktype);
    std::__cxx11::string::~string((string *)&ktype);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  return;
}

Assistant:

void t_json_generator::write_type_spec(t_type* ttype) {
  ttype = ttype->get_true_type();

  write_string(get_type_name(ttype));

  if (ttype->annotations_.size() > 0) {
    write_key_and("annotations");
    start_object();
    for (auto & annotation : ttype->annotations_) {
      write_key_and_string(annotation.first, annotation.second);
    }
    end_object();
  }

  if (ttype->is_struct() || ttype->is_xception()) {
    write_key_and_string("class", get_qualified_name(ttype));
  } else if (ttype->is_map()) {
    t_type* ktype = ((t_map*)ttype)->get_key_type();
    t_type* vtype = ((t_map*)ttype)->get_val_type();
    write_key_and_string("keyTypeId", get_type_name(ktype));
    write_key_and_string("valueTypeId", get_type_name(vtype));
    write_type_spec_object("keyType", ktype);
    write_type_spec_object("valueType", vtype);
  } else if (ttype->is_list()) {
    t_type* etype = ((t_list*)ttype)->get_elem_type();
    write_key_and_string("elemTypeId", get_type_name(etype));
    write_type_spec_object("elemType", etype);
  } else if (ttype->is_set()) {
    t_type* etype = ((t_set*)ttype)->get_elem_type();
    write_key_and_string("elemTypeId", get_type_name(etype));
    write_type_spec_object("elemType", etype);
  }
}